

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::initFactorMatrix(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         **vec,
                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *eps)

{
  fpclass_type *pfVar1;
  U *pUVar2;
  Col *pCVar3;
  Dring *pDVar4;
  Dring *pDVar5;
  uint uVar6;
  uint uVar7;
  fpclass_type fVar8;
  uint uVar9;
  int p_row;
  fpclass_type fVar10;
  fpclass_type fVar11;
  fpclass_type fVar12;
  int *piVar13;
  int *piVar14;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar15;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar16;
  int32_t iVar17;
  int32_t iVar18;
  int32_t iVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  byte bVar22;
  int iVar23;
  long_long_type lVar24;
  undefined8 *puVar25;
  uint *puVar26;
  pointer pnVar27;
  long lVar28;
  ulong uVar29;
  int iVar30;
  long lVar31;
  Dring *pDVar32;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar33;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar34;
  uint *puVar35;
  long lVar36;
  uint *puVar37;
  cpp_dec_float<200U,_int,_void> *pcVar38;
  uint *puVar39;
  long lVar40;
  Dring *pDVar41;
  int iVar42;
  Dring *pDVar43;
  byte bVar44;
  longlong i;
  Dring *pDVar45;
  byte bVar46;
  cpp_dec_float<200U,_int,_void> vv;
  int local_52c;
  cpp_dec_float<200U,_int,_void> local_4f0;
  int *local_470;
  undefined1 local_468 [32];
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [13];
  undefined3 uStack_3fb;
  int iStack_3f8;
  bool bStack_3f4;
  undefined8 local_3f0;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 auStack_398 [12];
  undefined4 local_38c;
  undefined1 auStack_388 [12];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_37c;
  cpp_dec_float<200U,_int,_void> local_2fc;
  cpp_dec_float<200U,_int,_void> local_27c;
  cpp_dec_float<200U,_int,_void> local_1fc;
  uint local_17c [27];
  uint local_110 [28];
  uint local_a0 [28];
  
  bVar46 = 0;
  auStack_388 = SUB1612((undefined1  [16])0x0,4);
  auStack_398 = SUB1612((undefined1  [16])0x0,0);
  local_38c = 0;
  local_3a8 = (undefined1  [16])0x0;
  local_3b8 = (undefined1  [16])0x0;
  local_3c8 = (undefined1  [16])0x0;
  local_3d8 = (undefined1  [16])0x0;
  local_3e8 = (undefined1  [16])0x0;
  local_470 = (this->temp).s_mark;
  if (0 < this->thedim) {
    piVar13 = (this->u).row.len;
    piVar14 = (this->u).row.max;
    lVar36 = 0;
    do {
      piVar13[lVar36] = 0;
      piVar14[lVar36] = 0;
      lVar36 = lVar36 + 1;
      uVar29 = (ulong)this->thedim;
    } while (lVar36 < (long)uVar29);
    iVar42 = 0;
    if (0 < this->thedim) {
      piVar13 = (this->u).row.max;
      lVar36 = 0;
      do {
        iVar30 = vec[lVar36]->memused;
        if ((long)iVar30 < 2) {
          if (iVar30 == 0) goto LAB_0052a67f;
        }
        else {
          pNVar15 = vec[lVar36]->m_elem;
          lVar40 = 0;
          do {
            piVar14 = piVar13 + *(int *)((long)(&pNVar15->val + 1) + lVar40);
            *piVar14 = *piVar14 + 1;
            lVar40 = lVar40 + 0x84;
          } while ((long)iVar30 * 0x84 != lVar40);
          iVar42 = iVar30 + iVar42;
          uVar29 = (ulong)(uint)this->thedim;
        }
        lVar36 = lVar36 + 1;
      } while (lVar36 < (int)uVar29);
      i = (longlong)iVar42;
      goto LAB_00529bbd;
    }
  }
  i = 0;
LAB_00529bbd:
  local_3f0._0_4_ = cpp_dec_float_finite;
  local_3f0._4_4_ = 0x1c;
  local_468._0_16_ = (undefined1  [16])0x0;
  local_468._16_16_ = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_408 = SUB1613((undefined1  [16])0x0,0);
  uStack_3fb = 0;
  iStack_3f8 = 0;
  bStack_3f4 = false;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_4f0,i,(type *)0x0);
  if ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
       *)local_468 != &this->rowMemMult) {
    pnVar33 = &this->rowMemMult;
    puVar37 = (uint *)local_468;
    for (lVar36 = 0x1c; lVar36 != 0; lVar36 = lVar36 + -1) {
      *puVar37 = (pnVar33->m_backend).data._M_elems[0];
      pnVar33 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar33 + (ulong)bVar46 * -8 + 4);
      puVar37 = puVar37 + (ulong)bVar46 * -2 + 1;
    }
    iStack_3f8 = (this->rowMemMult).m_backend.exp;
    bStack_3f4 = (this->rowMemMult).m_backend.neg;
    local_3f0._0_4_ = (this->rowMemMult).m_backend.fpclass;
    local_3f0._4_4_ = (this->rowMemMult).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            ((cpp_dec_float<200U,_int,_void> *)local_468,&local_4f0);
  lVar36 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_signed_long_long
                     ((cpp_dec_float<200U,_int,_void> *)local_468);
  if (lVar36 < -0x7fffffff) {
    lVar36 = -0x80000000;
  }
  if (0x7ffffffe < lVar36) {
    lVar36 = 0x7fffffff;
  }
  minRowMem(this,(int)lVar36);
  local_3f0._0_4_ = cpp_dec_float_finite;
  local_3f0._4_4_ = 0x1c;
  local_468._0_16_ = (undefined1  [16])0x0;
  local_468._16_16_ = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_408 = SUB1613((undefined1  [16])0x0,0);
  uStack_3fb = 0;
  iStack_3f8 = 0;
  bStack_3f4 = false;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_4f0,i,(type *)0x0);
  if ((cpp_dec_float<200U,_int,_void> *)local_468 != &(this->colMemMult).m_backend) {
    pnVar33 = &this->colMemMult;
    puVar37 = (uint *)local_468;
    for (lVar36 = 0x1c; lVar36 != 0; lVar36 = lVar36 + -1) {
      *puVar37 = (pnVar33->m_backend).data._M_elems[0];
      pnVar33 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar33 + (ulong)bVar46 * -8 + 4);
      puVar37 = puVar37 + (ulong)bVar46 * -2 + 1;
    }
    iStack_3f8 = (this->colMemMult).m_backend.exp;
    bStack_3f4 = (this->colMemMult).m_backend.neg;
    local_3f0._0_4_ = (this->colMemMult).m_backend.fpclass;
    local_3f0._4_4_ = (this->colMemMult).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            ((cpp_dec_float<200U,_int,_void> *)local_468,&local_4f0);
  lVar24 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_signed_long_long
                     ((cpp_dec_float<200U,_int,_void> *)local_468);
  lVar36 = -0x80000000;
  if (-0x80000000 < lVar24) {
    lVar36 = lVar24;
  }
  if (0x7ffffffe < lVar36) {
    lVar36 = 0x7fffffff;
  }
  iVar42 = (int)lVar36;
  if ((this->u).col.size < iVar42) {
    (this->u).col.size = iVar42;
    spx_realloc<int*>(&(this->u).col.idx,iVar42);
  }
  local_3f0._0_4_ = cpp_dec_float_finite;
  local_3f0._4_4_ = 0x1c;
  local_468._0_16_ = (undefined1  [16])0x0;
  local_468._16_16_ = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_418 = (undefined1  [16])0x0;
  local_408 = SUB1613((undefined1  [16])0x0,0);
  uStack_3fb = 0;
  iStack_3f8 = 0;
  bStack_3f4 = false;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_4f0,i,(type *)0x0);
  if ((cpp_dec_float<200U,_int,_void> *)local_468 != &(this->lMemMult).m_backend) {
    pnVar33 = &this->lMemMult;
    puVar37 = (uint *)local_468;
    for (lVar36 = 0x1c; lVar36 != 0; lVar36 = lVar36 + -1) {
      *puVar37 = (pnVar33->m_backend).data._M_elems[0];
      pnVar33 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar33 + (ulong)bVar46 * -8 + 4);
      puVar37 = puVar37 + (ulong)bVar46 * -2 + 1;
    }
    iStack_3f8 = (this->lMemMult).m_backend.exp;
    bStack_3f4 = (this->lMemMult).m_backend.neg;
    local_3f0._0_4_ = (this->lMemMult).m_backend.fpclass;
    local_3f0._4_4_ = (this->lMemMult).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            ((cpp_dec_float<200U,_int,_void> *)local_468,&local_4f0);
  lVar24 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_signed_long_long
                     ((cpp_dec_float<200U,_int,_void> *)local_468);
  lVar36 = -0x80000000;
  if (-0x80000000 < lVar24) {
    lVar36 = lVar24;
  }
  if (0x7ffffffe < lVar36) {
    lVar36 = 0x7fffffff;
  }
  minLMem(this,(int)lVar36);
  pUVar2 = &this->u;
  piVar13 = (this->u).row.start;
  *piVar13 = 0;
  pDVar32 = (this->u).row.elem;
  piVar14 = (this->u).row.max;
  iVar42 = this->thedim;
  lVar36 = (long)iVar42;
  pCVar3 = &(this->u).col;
  (this->u).row.list.idx = iVar42;
  (this->u).row.list.next = pDVar32;
  pDVar41 = (this->u).col.elem;
  (this->u).col.list.idx = iVar42;
  (this->u).col.list.next = pDVar41;
  if (lVar36 < 1) {
    iVar42 = 0;
    pDVar32 = (Dring *)pUVar2;
    pDVar41 = &pCVar3->list;
  }
  else {
    lVar31 = 0;
    iVar42 = 0;
    lVar40 = 0;
    pDVar43 = (Dring *)pUVar2;
    pDVar45 = &pCVar3->list;
    do {
      lVar28 = lVar40;
      pDVar4 = (Dring *)((long)&pDVar32->next + lVar28);
      pDVar5 = (Dring *)((long)&pDVar41->next + lVar28);
      piVar13[lVar31] = iVar42;
      iVar42 = iVar42 + piVar14[lVar31];
      *(int *)((long)&pDVar32->idx + lVar28) = (int)lVar31;
      *(Dring **)((long)&pDVar32->prev + lVar28) = pDVar43;
      (((Row *)&pDVar43->next)->list).next = pDVar4;
      *(int *)((long)&pDVar41->idx + lVar28) = (int)lVar31;
      *(Dring **)((long)&pDVar41->prev + lVar28) = pDVar45;
      ((Dring *)&pDVar45->next)->next = pDVar5;
      lVar31 = lVar31 + 1;
      lVar36 = (long)this->thedim;
      lVar40 = lVar28 + 0x18;
      pDVar43 = pDVar4;
      pDVar45 = pDVar5;
    } while (lVar31 < lVar36);
    pDVar32 = (Dring *)((long)&pDVar32->next + lVar28);
    pDVar41 = (Dring *)((long)&pDVar41->next + lVar28);
  }
  piVar13[lVar36] = 0;
  piVar14[this->thedim] = 0;
  (this->u).row.used = iVar42;
  (((Row *)&pDVar32->next)->list).next = (Dring *)pUVar2;
  (this->u).row.list.prev = pDVar32;
  ((Dring *)&pDVar41->next)->next = &pCVar3->list;
  (this->u).col.list.prev = pDVar41;
  (this->temp).stage = 0;
  pnVar33 = &this->initMaxabs;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&pnVar33->m_backend,0);
  iVar42 = 0;
  if (0 < this->thedim) {
    puVar37 = (this->initMaxabs).m_backend.data._M_elems + 1;
    lVar36 = 0;
    iVar42 = 0;
    do {
      pSVar16 = vec[lVar36];
      (this->u).col.start[lVar36] = iVar42;
      if (pSVar16->memused < 1) {
LAB_0052a67f:
        this->stat = SINGULAR;
        return;
      }
      iVar30 = 0;
      lVar31 = 0x78;
      lVar40 = 1;
      do {
        puVar25 = (undefined8 *)((long)(pSVar16->m_elem->val).m_backend.data._M_elems + lVar31);
        puVar35 = (uint *)(puVar25 + -0xf);
        puVar39 = local_a0;
        for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
          *puVar39 = *puVar35;
          puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
          puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
        }
        local_4f0.exp = *(int *)(puVar25 + -1);
        local_4f0.neg = *(bool *)((long)puVar25 + -4);
        local_4f0._120_8_ = *puVar25;
        pnVar34 = eps;
        pcVar38 = &local_27c;
        for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
          (pcVar38->data)._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
          pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar34 + ((ulong)bVar46 * -2 + 1) * 4);
          pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + ((ulong)bVar46 * -2 + 1) * 4)
          ;
        }
        local_27c.exp = (eps->m_backend).exp;
        local_27c.neg = (eps->m_backend).neg;
        fVar10 = (eps->m_backend).fpclass;
        iVar17 = (eps->m_backend).prec_elem;
        local_27c.fpclass = fVar10;
        local_27c.prec_elem = iVar17;
        puVar35 = local_a0;
        pcVar38 = &local_4f0;
        for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
          (pcVar38->data)._M_elems[0] = *puVar35;
          puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
          pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar46 * -8 + 4);
        }
        if ((local_4f0.neg == true) &&
           (local_4f0.data._M_elems[0] != 0 || local_4f0.fpclass != cpp_dec_float_finite)) {
          local_4f0.neg = false;
        }
        if (fVar10 != cpp_dec_float_NaN && local_4f0.fpclass != cpp_dec_float_NaN) {
          iVar23 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_4f0,&local_27c);
          iVar30 = iVar30 + (uint)(0 < iVar23);
        }
        if (pSVar16->memused <= lVar40) break;
        lVar31 = lVar31 + 0x84;
        lVar40 = lVar40 + 1;
      } while (iVar30 < 2);
      iVar23 = (int)lVar36;
      if (iVar30 == 1) {
        lVar40 = 0;
        do {
          lVar31 = lVar40;
          pNVar15 = pSVar16->m_elem;
          puVar35 = (uint *)((long)(pNVar15->val).m_backend.data._M_elems + lVar31);
          puVar39 = local_110;
          for (lVar40 = 0x1c; lVar40 != 0; lVar40 = lVar40 + -1) {
            *puVar39 = *puVar35;
            puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
            puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
          }
          local_4f0.exp = *(int *)((long)(&(pNVar15->val).m_backend.data + 1) + lVar31);
          local_4f0.neg = *(bool *)((long)(&(pNVar15->val).m_backend.data + 1) + lVar31 + 4);
          local_4f0._120_8_ =
               *(undefined8 *)((long)(&(pNVar15->val).m_backend.data + 1) + lVar31 + 8);
          pnVar34 = eps;
          pcVar38 = &local_1fc;
          for (lVar40 = 0x1c; lVar40 != 0; lVar40 = lVar40 + -1) {
            (pcVar38->data)._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
            pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar34 + ((ulong)bVar46 * -2 + 1) * 4);
            pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar46 * -8 + 4);
          }
          local_1fc.exp = (eps->m_backend).exp;
          local_1fc.neg = (eps->m_backend).neg;
          fVar12 = (eps->m_backend).fpclass;
          iVar19 = (eps->m_backend).prec_elem;
          local_1fc.fpclass = fVar12;
          local_1fc.prec_elem = iVar19;
          puVar35 = local_110;
          pcVar38 = &local_4f0;
          for (lVar40 = 0x1c; lVar40 != 0; lVar40 = lVar40 + -1) {
            (pcVar38->data)._M_elems[0] = *puVar35;
            puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
            pcVar38 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar38 + (ulong)bVar46 * -8 + 4);
          }
          if ((local_4f0.neg == true) &&
             (local_4f0.data._M_elems[0] != 0 || local_4f0.fpclass != cpp_dec_float_finite)) {
            local_4f0.neg = false;
          }
          if ((local_4f0.fpclass == cpp_dec_float_NaN) || (fVar12 == cpp_dec_float_NaN)) break;
          iVar30 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_4f0,&local_1fc);
          lVar40 = lVar31 + 0x84;
        } while (iVar30 < 1);
        if (-1 < (this->row).perm[*(int *)((long)(&pSVar16->m_elem->val + 1) + lVar31)])
        goto LAB_0052a67f;
        puVar26 = (uint *)((long)(pSVar16->m_elem->val).m_backend.data._M_elems + lVar31);
        uVar6 = *puVar26;
        puVar35 = puVar26 + 1;
        puVar39 = (uint *)local_3e8;
        for (lVar40 = 0x1b; lVar40 != 0; lVar40 = lVar40 + -1) {
          *puVar39 = *puVar35;
          puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
          puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
        }
        uVar7 = puVar26[0x1c];
        bVar44 = (byte)puVar26[0x1d];
        fVar8 = puVar26[0x1e];
        uVar9 = puVar26[0x1f];
        uVar20 = *(undefined8 *)(puVar26 + 0x1e);
        puVar35 = (uint *)local_3e8;
        puVar39 = local_4f0.data._M_elems + 1;
        for (lVar40 = 0x1b; lVar40 != 0; lVar40 = lVar40 + -1) {
          *puVar39 = *puVar35;
          puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
          puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
        }
        local_4f0.neg = (bool)bVar44;
        if ((bVar44 == 1) && (fVar8 != cpp_dec_float_finite || uVar6 != 0)) {
          local_4f0.neg = false;
        }
        local_4f0.data._M_elems[0] = uVar6;
        local_4f0.exp = uVar7;
        local_4f0._120_8_ = uVar20;
        if (((fVar8 != cpp_dec_float_NaN) &&
            ((this->initMaxabs).m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar30 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_4f0,&pnVar33->m_backend), 0 < iVar30)) {
          bVar22 = bVar44;
          if (bVar44 != 0) {
            bVar22 = (fVar8 != cpp_dec_float_finite || uVar6 != 0) ^ bVar44;
          }
          (this->initMaxabs).m_backend.data._M_elems[0] = uVar6;
          puVar35 = (uint *)local_3e8;
          puVar39 = puVar37;
          for (lVar40 = 0x1b; lVar40 != 0; lVar40 = lVar40 + -1) {
            *puVar39 = *puVar35;
            puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
            puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
          }
          (this->initMaxabs).m_backend.exp = uVar7;
          (this->initMaxabs).m_backend.neg = (bool)bVar22;
          (this->initMaxabs).m_backend.fpclass = fVar8;
          (this->initMaxabs).m_backend.prec_elem = uVar9;
        }
        iVar30 = (this->temp).stage;
        p_row = *(int *)((long)(&pSVar16->m_elem->val + 1) + lVar31);
        local_37c.m_backend.data._M_elems[0] = uVar6;
        puVar35 = (uint *)local_3e8;
        puVar39 = local_37c.m_backend.data._M_elems + 1;
        for (lVar40 = 0x1b; lVar40 != 0; lVar40 = lVar40 + -1) {
          *puVar39 = *puVar35;
          puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
          puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
        }
        local_37c.m_backend.exp = uVar7;
        local_37c.m_backend.neg = (bool)bVar44;
        local_37c.m_backend.fpclass = fVar8;
        local_37c.m_backend.prec_elem = uVar9;
        setPivot(this,iVar30,iVar23,p_row,&local_37c);
        local_470[(this->temp).stage] = iVar23;
        piVar13 = &(this->temp).stage;
        *piVar13 = *piVar13 + 1;
        local_52c = 0;
      }
      else {
        if (iVar30 == 0) goto LAB_0052a67f;
        if (pSVar16->memused < 1) {
          local_52c = 0;
        }
        else {
          lVar31 = 0;
          lVar40 = 0;
          local_52c = 0;
          do {
            puVar26 = (uint *)((long)(pSVar16->m_elem->val).m_backend.data._M_elems + lVar31);
            uVar6 = *puVar26;
            puVar35 = puVar26 + 1;
            puVar39 = (uint *)local_3e8;
            for (lVar28 = 0x1b; lVar28 != 0; lVar28 = lVar28 + -1) {
              *puVar39 = *puVar35;
              puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
              puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
            }
            uVar7 = puVar26[0x1c];
            bVar44 = (byte)puVar26[0x1d];
            pfVar1 = puVar26 + 0x1e;
            fVar8 = *pfVar1;
            uVar9 = puVar26[0x1f];
            uVar21 = *(undefined8 *)pfVar1;
            uVar20 = *(undefined8 *)pfVar1;
            puVar35 = puVar26 + 1;
            puVar39 = local_17c;
            for (lVar28 = 0x1b; lVar28 != 0; lVar28 = lVar28 + -1) {
              *puVar39 = *puVar35;
              puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
              puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
            }
            pnVar34 = eps;
            pcVar38 = &local_2fc;
            for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
              (pcVar38->data)._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + ((ulong)bVar46 * -2 + 1) * 4);
              pcVar38 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar38 + ((ulong)bVar46 * -2 + 1) * 4);
            }
            local_2fc.exp = (eps->m_backend).exp;
            local_2fc.neg = (eps->m_backend).neg;
            fVar11 = (eps->m_backend).fpclass;
            iVar18 = (eps->m_backend).prec_elem;
            local_2fc.fpclass = fVar11;
            local_2fc.prec_elem = iVar18;
            puVar35 = local_17c;
            puVar39 = local_4f0.data._M_elems + 1;
            for (lVar28 = 0x1b; lVar28 != 0; lVar28 = lVar28 + -1) {
              *puVar39 = *puVar35;
              puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
              puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
            }
            local_4f0.neg = (bool)bVar44;
            if (((bool)bVar44 == true) && (fVar8 != cpp_dec_float_finite || uVar6 != 0)) {
              local_4f0.neg = false;
            }
            local_4f0.data._M_elems[0] = uVar6;
            if ((fVar11 != cpp_dec_float_NaN && fVar8 != cpp_dec_float_NaN) &&
               (local_4f0.exp = uVar7, local_4f0._120_8_ = uVar20,
               iVar30 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&local_4f0,&local_2fc), 0 < iVar30)) {
              iVar30 = *(int *)((long)(&pSVar16->m_elem->val + 1) + lVar31);
              (this->u).col.idx[iVar42] = iVar30;
              lVar28 = (long)(this->u).row.len[iVar30] + (long)(this->u).row.start[iVar30];
              (this->u).row.idx[lVar28] = iVar23;
              pnVar27 = (this->u).row.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar28;
              (pnVar27->m_backend).data._M_elems[0] = uVar6;
              puVar35 = (uint *)local_3e8;
              puVar39 = (uint *)((long)(pnVar27->m_backend).data._M_elems + 4);
              for (lVar28 = 0x1b; lVar28 != 0; lVar28 = lVar28 + -1) {
                *puVar39 = *puVar35;
                puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
                puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
              }
              (pnVar27->m_backend).exp = uVar7;
              (pnVar27->m_backend).neg = (bool)bVar44;
              (pnVar27->m_backend).fpclass = fVar8;
              (pnVar27->m_backend).prec_elem = uVar9;
              piVar13 = (this->u).row.len + iVar30;
              *piVar13 = *piVar13 + 1;
              puVar35 = (uint *)local_3e8;
              puVar39 = local_4f0.data._M_elems + 1;
              for (lVar28 = 0x1b; lVar28 != 0; lVar28 = lVar28 + -1) {
                *puVar39 = *puVar35;
                puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
                puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
              }
              local_4f0.neg = (bool)bVar44;
              if (((bool)bVar44 != false) && (fVar8 != cpp_dec_float_finite || uVar6 != 0)) {
                local_4f0.neg = (bool)(bVar44 ^ 1);
              }
              local_4f0.data._M_elems[0] = uVar6;
              if (((this->initMaxabs).m_backend.fpclass != cpp_dec_float_NaN) &&
                 (local_4f0.exp = uVar7, local_4f0._120_8_ = uVar21,
                 iVar30 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    (&local_4f0,&pnVar33->m_backend), 0 < iVar30)) {
                if ((bool)bVar44 != false) {
                  bVar44 = bVar44 ^ (fVar8 != cpp_dec_float_finite || uVar6 != 0);
                }
                (this->initMaxabs).m_backend.data._M_elems[0] = uVar6;
                puVar35 = (uint *)local_3e8;
                puVar39 = puVar37;
                for (lVar28 = 0x1b; lVar28 != 0; lVar28 = lVar28 + -1) {
                  *puVar39 = *puVar35;
                  puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
                  puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
                }
                (this->initMaxabs).m_backend.exp = uVar7;
                (this->initMaxabs).m_backend.neg = (bool)bVar44;
                (this->initMaxabs).m_backend.fpclass = fVar8;
                (this->initMaxabs).m_backend.prec_elem = uVar9;
              }
              iVar42 = iVar42 + 1;
              local_52c = local_52c + 1;
            }
            lVar40 = lVar40 + 1;
            lVar31 = lVar31 + 0x84;
          } while (lVar40 < pSVar16->memused);
        }
      }
      (this->u).col.max[lVar36] = local_52c;
      (this->u).col.len[lVar36] = local_52c;
      (this->temp).s_cact[lVar36] = local_52c;
      lVar36 = lVar36 + 1;
    } while (lVar36 < this->thedim);
  }
  (this->u).col.used = iVar42;
  return;
}

Assistant:

void CLUFactor<R>::initFactorMatrix(const SVectorBase<R>** vec, const R eps)
{

   R x;
   int m;
   int tot;
   Dring* rring, *lastrring;
   Dring* cring, *lastcring;
   const SVectorBase<R>* psv;
   int* sing = temp.s_mark;

   /*  Initialize:
    *  - column file thereby remembering column singletons in |sing|.
    *  - nonzeros counts per row
    *  - total number of nonzeros
    */

   for(int i = 0; i < thedim; i++)
      u.row.max[i] = u.row.len[i] = 0;

   tot = 0;

   for(int i = 0; i < thedim; i++)
   {
      int k;

      psv = vec[i];
      k = psv->size();

      if(k > 1)
      {
         tot += k;

         for(int j = 0; j < k; ++j)
            u.row.max[psv->index(j)]++;
      }
      else if(k == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }
   }

   /*  Resize nonzero memory if necessary
    */
   minRowMem(int(rowMemMult * tot));

   minColMem(int(colMemMult * tot));

   minLMem(int(lMemMult * tot));


   /*  Initialize:
    *  - row ring lists
    *  - row vectors in file
    *  - column ring lists
    */
   u.row.start[0] = 0;

   rring = u.row.elem;

   lastrring = &(u.row.list);

   lastrring->idx = thedim;

   lastrring->next = rring;

   cring = u.col.elem;

   lastcring = &(u.col.list);

   lastcring->idx = thedim;

   lastcring->next = cring;

   m = 0;

   for(int i = 0; i < thedim; i++)
   {
      u.row.start[i] = m;
      m += u.row.max[i];

      rring->idx = i;
      rring->prev = lastrring;
      lastrring->next = rring;
      lastrring = rring;
      ++rring;

      cring->idx = i;
      cring->prev = lastcring;
      lastcring->next = cring;
      lastcring = cring;
      ++cring;
   }

   u.row.start[thedim]       = 0;

   u.row.max[thedim]       = 0;
   u.row.used = m;

   lastrring->next = &(u.row.list);
   lastrring->next->prev = lastrring;

   lastcring->next = &(u.col.list);
   lastcring->next->prev = lastcring;

   /*  Copy matrix to row and column file
    *  excluding and marking column singletons!
    */
   m = 0;
   temp.stage = 0;

   initMaxabs = 0;

   for(int i = 0; i < thedim; i++)
   {
      int nnonzeros;

      psv = vec[i];
      u.col.start[i] = m;

      /* check whether number of nonzeros above tolerance is 0, 1 or >= 2 */
      nnonzeros = 0;

      for(int j = 0; j < psv->size() && nnonzeros <= 1; j++)
      {
         if(isNotZero(psv->value(j), eps))
            nnonzeros++;
      }

      /* basis is singular due to empty column */
      if(nnonzeros == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }

      /* exclude column singletons */
      else if(nnonzeros == 1)
      {
         int j = 0;

         /* find nonzero */

         for(j = 0; isZero(psv->value(j), eps); j++)
            ;

         assert(j < psv->size());

         /* basis is singular due to two linearly dependent column singletons */
         if(row.perm[psv->index(j)] >= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         /* update maximum absolute nonzero value */
         x = psv->value(j);

         if(spxAbs(x) > initMaxabs)
            initMaxabs = spxAbs(x);

         /* permute to front and mark as singleton */
         setPivot(temp.stage, i, psv->index(j), x);

         sing[temp.stage] = i;

         temp.stage++;

         /* set column length to zero */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = 0;
      }

      /* add to active matrix if not a column singleton */
      else
      {
         int end;
         int k;

         /* go through all nonzeros in column */
         assert(nnonzeros >= 2);
         nnonzeros = 0;

         for(int j = 0; j < psv->size(); j++)
         {
            x = psv->value(j);

            if(isNotZero(x, eps))
            {
               /* add to column array */
               k = psv->index(j);
               u.col.idx[m] = k;
               m++;

               /* add to row array */
               end = u.row.start[k] + u.row.len[k];
               u.row.idx[end] = i;
               u.row.val[end] = x;
               u.row.len[k]++;

               /* update maximum absolute nonzero value */

               if(spxAbs(x) > initMaxabs)
                  initMaxabs = spxAbs(x);

               nnonzeros++;
            }
         }

         assert(nnonzeros >= 2);

         /* set column length */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = nnonzeros;
      }
   }

   u.col.used = m;
}